

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle.cpp
# Opt level: O0

void __thiscall
QFusionStyle::drawItemText
          (QFusionStyle *this,QPainter *painter,QRect *rect,int alignment,QPalette *pal,bool enabled
          ,QString *text,ColorRole textRole)

{
  bool bVar1;
  QPen *pQVar2;
  QBrush *pQVar3;
  uint in_ECX;
  int in_EDX;
  QPalette *in_RSI;
  long in_FS_OFFSET;
  double dVar4;
  QRect *in_stack_00000008;
  int in_stack_00000010;
  QPen savedPen;
  undefined8 in_stack_ffffffffffffffa8;
  ColorRole cr;
  QPalette *pQVar5;
  QPen local_18 [8];
  undefined1 *local_10;
  long local_8;
  
  cr = (ColorRole)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QString::isEmpty((QString *)0x4da84b);
  if (!bVar1) {
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = (QPen *)QPainter::pen();
    QPen::QPen((QPen *)&local_10,pQVar2);
    if (in_stack_00000010 != 0x11) {
      pQVar5 = in_RSI;
      pQVar3 = QPalette::brush(in_RSI,cr);
      dVar4 = (double)QPen::widthF();
      QPen::QPen(local_18,pQVar3,dVar4,SolidLine,SquareCap,BevelJoin);
      QPainter::setPen((QPen *)pQVar5);
      QPen::~QPen(local_18);
    }
    QPainter::drawText((QRect *)in_RSI,in_EDX,(QString *)(ulong)in_ECX,in_stack_00000008);
    QPainter::setPen((QPen *)in_RSI);
    QPen::~QPen((QPen *)&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFusionStyle::drawItemText(QPainter *painter, const QRect &rect, int alignment, const QPalette &pal,
                                bool enabled, const QString& text, QPalette::ColorRole textRole) const
{
    Q_UNUSED(enabled);
    if (text.isEmpty())
        return;

    QPen savedPen = painter->pen();
    if (textRole != QPalette::NoRole)
        painter->setPen(QPen(pal.brush(textRole), savedPen.widthF()));
    painter->drawText(rect, alignment, text);
    painter->setPen(savedPen);
}